

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
edition_unittest::TestCamelCaseFieldNames::_InternalSerialize
          (TestCamelCaseFieldNames *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int *piVar1;
  ForeignMessage *value;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  WireFormatLite *pWVar6;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar7;
  Value<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>_> *value_00
  ;
  int *piVar8;
  uint8_t *puVar9;
  WireFormatLite *extraout_RAX;
  WireFormatLite *pWVar10;
  WireFormatLite *extraout_RAX_00;
  uint uVar11;
  WireFormatLite *in_RCX;
  ulong uVar12;
  ulong uVar13;
  TestCamelCaseFieldNames *pTVar14;
  uint uVar15;
  int iVar16;
  char *in_R9;
  TestCamelCaseFieldNames *unaff_R12;
  EpsCopyOutputStream *pEVar17;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view s_04;
  string_view field_name;
  string_view field_name_00;
  string_view field_name_01;
  string_view field_name_02;
  string_view field_name_03;
  string_view field_name_04;
  
  uVar15 = *(uint *)&this->field_0;
  if ((uVar15 & 0x10) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.primitivefield_,target);
  }
  if ((uVar15 & 1) != 0) {
    puVar5 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.stringfield_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    in_RCX = (WireFormatLite *)*puVar5;
    unaff_R12 = (TestCamelCaseFieldNames *)puVar5[1];
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"edition_unittest.TestCamelCaseFieldNames.StringField";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (in_RCX,(char *)((ulong)unaff_R12 & 0xffffffff),1,0x34,field_name);
    s._M_str = (char *)in_RCX;
    s._M_len = (size_t)unaff_R12;
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s,target);
  }
  pTVar14 = this;
  if ((uVar15 & 0x20) == 0) goto LAB_00c541fe;
  if ((WireFormatLite *)stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  in_RCX = (WireFormatLite *)(long)(this->field_0)._impl_.enumfield_;
  pWVar6 = (WireFormatLite *)target + 1;
  *target = '\x18';
  pWVar10 = in_RCX;
  if ((WireFormatLite *)0x7f < in_RCX) goto LAB_00c54759;
  while( true ) {
    *pWVar6 = SUB81(in_RCX,0);
    target = (uint8_t *)(pWVar6 + 1);
LAB_00c541fe:
    pWVar6 = (WireFormatLite *)target;
    if ((uVar15 & 8) != 0) {
      value = (pTVar14->field_0)._impl_.messagefield_;
      pWVar6 = (WireFormatLite *)
               google::protobuf::internal::WireFormatLite::InternalWriteMessage
                         (4,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
      in_RCX = (WireFormatLite *)target;
    }
    if ((uVar15 & 2) != 0) {
      puVar5 = (undefined8 *)
               ((ulong)(pTVar14->field_0)._impl_.stringpiecefield_.tagged_ptr_.ptr_ &
               0xfffffffffffffffc);
      in_RCX = (WireFormatLite *)*puVar5;
      unaff_R12 = (TestCamelCaseFieldNames *)puVar5[1];
      field_name_00._M_str = in_R9;
      field_name_00._M_len = (size_t)"edition_unittest.TestCamelCaseFieldNames.StringPieceField";
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (in_RCX,(char *)((ulong)unaff_R12 & 0xffffffff),1,0x39,field_name_00);
      s_00._M_str = (char *)in_RCX;
      s_00._M_len = (size_t)unaff_R12;
      pWVar6 = (WireFormatLite *)
               google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,5,s_00,(uint8_t *)pWVar6);
    }
    if ((uVar15 & 4) != 0) {
      puVar5 = (undefined8 *)
               ((ulong)(this->field_0)._impl_.cordfield_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      field_name_01._M_str = in_R9;
      field_name_01._M_len = (size_t)"edition_unittest.TestCamelCaseFieldNames.CordField";
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)*puVar5,(char *)(ulong)*(uint *)(puVar5 + 1),1,0x32,field_name_01
                );
      in_RCX = (WireFormatLite *)*puVar5;
      s_01._M_str = (char *)in_RCX;
      s_01._M_len = puVar5[1];
      pWVar6 = (WireFormatLite *)
               google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,6,s_01,(uint8_t *)pWVar6);
    }
    uVar11 = *(uint *)((long)&this->field_0 + 0x18);
    pTVar14 = (TestCamelCaseFieldNames *)(ulong)uVar11;
    pEVar17 = stream;
    if (0 < (int)uVar11) {
      if ((WireFormatLite *)stream->end_ <= pWVar6) {
        pWVar6 = (WireFormatLite *)
                 google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback
                           (stream,(uint8_t *)pWVar6);
      }
      if ((WireFormatLite *)stream->end_ <= pWVar6) {
        _InternalSerialize();
        pWVar10 = extraout_RAX;
        goto LAB_00c54719;
      }
      pEVar17 = (EpsCopyOutputStream *)&(this->field_0)._impl_.repeatedprimitivefield_;
      *pWVar6 = (WireFormatLite)0x3a;
      pWVar10 = pWVar6 + 1;
      if (0x7f < uVar11) {
        do {
          pWVar6 = pWVar10;
          uVar11 = (uint)pTVar14;
          *pWVar6 = (WireFormatLite)((byte)pTVar14 | 0x80);
          pTVar14 = (TestCamelCaseFieldNames *)((ulong)pTVar14 >> 7);
          pWVar10 = pWVar6 + 1;
        } while (0x3fff < uVar11);
      }
      *pWVar10 = SUB81(pTVar14,0);
      if ((undefined1  [16])
          ((undefined1  [16])(((RepeatedField<int> *)pEVar17)->soo_rep_).field_0 &
          (undefined1  [16])0x4) == (undefined1  [16])0x0) {
        piVar8 = (int *)((long)&this->field_0 + 0x10);
      }
      else {
        piVar8 = (int *)google::protobuf::internal::LongSooRep::elements((LongSooRep *)pEVar17);
      }
      pWVar6 = pWVar6 + 2;
      iVar4 = google::protobuf::internal::SooRep::size
                        ((SooRep *)pEVar17,
                         (undefined1  [16])
                         ((undefined1  [16])(((RepeatedField<int> *)pEVar17)->soo_rep_).field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
      piVar1 = piVar8 + iVar4;
      do {
        if ((WireFormatLite *)stream->end_ <= pWVar6) {
          pWVar6 = (WireFormatLite *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback
                             (stream,(uint8_t *)pWVar6);
        }
        in_RCX = (WireFormatLite *)(long)*piVar8;
        pWVar10 = in_RCX;
        if ((WireFormatLite *)0x7f < in_RCX) {
          do {
            *pWVar6 = (WireFormatLite)((byte)pWVar10 | 0x80);
            in_RCX = (WireFormatLite *)((ulong)pWVar10 >> 7);
            pWVar6 = pWVar6 + 1;
            bVar3 = (WireFormatLite *)0x3fff < pWVar10;
            pWVar10 = in_RCX;
          } while (bVar3);
        }
        piVar8 = piVar8 + 1;
        *pWVar6 = SUB81(in_RCX,0);
        pWVar6 = pWVar6 + 1;
      } while (piVar8 < piVar1);
    }
    uVar11 = *(uint *)((long)&this->field_0 + 0x28);
    if (0 < (int)uVar11) {
      uVar15 = 0;
      do {
        pVVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                           (&(this->field_0)._impl_.repeatedstringfield_.super_RepeatedPtrFieldBase,
                            uVar15);
        in_RCX = (WireFormatLite *)&DAT_0000003c;
        field_name_02._M_str = in_R9;
        field_name_02._M_len =
             (size_t)"edition_unittest.TestCamelCaseFieldNames.RepeatedStringField";
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  ((WireFormatLite *)(pVVar7->_M_dataplus)._M_p,
                   (char *)(ulong)(uint)pVVar7->_M_string_length,1,0x3c,field_name_02);
        pEVar17 = (EpsCopyOutputStream *)pVVar7->_M_string_length;
        if (((long)pEVar17 < 0x80) && ((long)pEVar17 <= (long)(stream->end_ + (0xe - (long)pWVar6)))
           ) {
          *pWVar6 = (WireFormatLite)0x42;
          pWVar6[1] = SUB81(pEVar17,0);
          memcpy(pWVar6 + 2,(pVVar7->_M_dataplus)._M_p,(size_t)pEVar17);
          pWVar6 = pWVar6 + (long)pEVar17 + 2;
        }
        else {
          in_RCX = (WireFormatLite *)(pVVar7->_M_dataplus)._M_p;
          s_02._M_str = (char *)in_RCX;
          s_02._M_len = (size_t)pEVar17;
          pWVar6 = (WireFormatLite *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                             (stream,8,s_02,(uint8_t *)pWVar6);
        }
        uVar15 = uVar15 + 1;
      } while (uVar11 != uVar15);
    }
    uVar11 = *(uint *)((long)&this->field_0 + 0x48);
    pTVar14 = (TestCamelCaseFieldNames *)(ulong)uVar11;
    if (uVar11 == 0) goto LAB_00c54489;
    if ((WireFormatLite *)stream->end_ <= pWVar6) {
      pWVar6 = (WireFormatLite *)
               google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback
                         (stream,(uint8_t *)pWVar6);
    }
    unaff_R12 = this;
    if (pWVar6 < (WireFormatLite *)stream->end_) break;
    _InternalSerialize();
    pWVar6 = extraout_RAX_00;
    pWVar10 = in_RCX;
    stream = pEVar17;
LAB_00c54759:
    do {
      *pWVar6 = (WireFormatLite)((byte)pWVar10 | 0x80);
      in_RCX = (WireFormatLite *)((ulong)pWVar10 >> 7);
      pWVar6 = pWVar6 + 1;
      bVar3 = (WireFormatLite *)0x3fff < pWVar10;
      pWVar10 = in_RCX;
    } while (bVar3);
  }
  pEVar17 = (EpsCopyOutputStream *)&(this->field_0)._impl_.repeatedenumfield_;
  *pWVar6 = (WireFormatLite)0x4a;
  pWVar10 = pWVar6 + 1;
  if (0x7f < uVar11) {
LAB_00c54719:
    do {
      pWVar6 = pWVar10;
      uVar15 = (uint)pTVar14;
      *pWVar6 = (WireFormatLite)((byte)pTVar14 | 0x80);
      pTVar14 = (TestCamelCaseFieldNames *)((ulong)pTVar14 >> 7);
      pWVar10 = pWVar6 + 1;
    } while (0x3fff < uVar15);
  }
  *pWVar10 = SUB81(pTVar14,0);
  if (((ulong)pEVar17->end_ & 4) == 0) {
    piVar8 = (int *)((long)&unaff_R12->field_0 + 0x40);
  }
  else {
    piVar8 = (int *)google::protobuf::internal::LongSooRep::elements((LongSooRep *)pEVar17);
  }
  pWVar6 = pWVar6 + 2;
  iVar4 = google::protobuf::internal::SooRep::size
                    ((SooRep *)pEVar17,((ulong)pEVar17->end_ & 4) == 0);
  piVar1 = piVar8 + iVar4;
  do {
    if ((WireFormatLite *)stream->end_ <= pWVar6) {
      pWVar6 = (WireFormatLite *)
               google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback
                         (stream,(uint8_t *)pWVar6);
    }
    uVar12 = (ulong)*piVar8;
    uVar13 = uVar12;
    if (0x7f < uVar12) {
      do {
        *pWVar6 = (WireFormatLite)((byte)uVar13 | 0x80);
        uVar12 = uVar13 >> 7;
        pWVar6 = pWVar6 + 1;
        bVar3 = 0x3fff < uVar13;
        uVar13 = uVar12;
      } while (bVar3);
    }
    piVar8 = piVar8 + 1;
    *pWVar6 = SUB81(uVar12,0);
    pWVar6 = pWVar6 + 1;
  } while (piVar8 < piVar1);
LAB_00c54489:
  iVar4 = *(int *)((long)&this->field_0 + 0x58);
  if (iVar4 != 0) {
    iVar16 = 0;
    do {
      value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>>
                           (&(this->field_0)._impl_.repeatedmessagefield_.super_RepeatedPtrFieldBase
                            ,iVar16);
      pWVar6 = (WireFormatLite *)
               google::protobuf::internal::WireFormatLite::InternalWriteMessage
                         (10,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                          (uint8_t *)pWVar6,stream);
      iVar16 = iVar16 + 1;
    } while (iVar4 != iVar16);
  }
  iVar4 = *(int *)((long)&this->field_0 + 0x70);
  if (0 < iVar4) {
    iVar16 = 0;
    do {
      pVVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.repeatedstringpiecefield_.
                           super_RepeatedPtrFieldBase,iVar16);
      field_name_03._M_str = in_R9;
      field_name_03._M_len =
           (size_t)"edition_unittest.TestCamelCaseFieldNames.RepeatedStringPieceField";
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)(pVVar7->_M_dataplus)._M_p,
                 (char *)(ulong)(uint)pVVar7->_M_string_length,1,0x41,field_name_03);
      sVar2 = pVVar7->_M_string_length;
      if (((long)sVar2 < 0x80) && ((long)sVar2 <= (long)(stream->end_ + (0xe - (long)pWVar6)))) {
        *pWVar6 = (WireFormatLite)0x5a;
        pWVar6[1] = SUB81(sVar2,0);
        memcpy(pWVar6 + 2,(pVVar7->_M_dataplus)._M_p,sVar2);
        pWVar6 = pWVar6 + sVar2 + 2;
      }
      else {
        s_03._M_str = (pVVar7->_M_dataplus)._M_p;
        s_03._M_len = sVar2;
        pWVar6 = (WireFormatLite *)
                 google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,0xb,s_03,(uint8_t *)pWVar6);
      }
      iVar16 = iVar16 + 1;
    } while (iVar4 != iVar16);
  }
  iVar4 = *(int *)((long)&this->field_0 + 0x88);
  if (0 < iVar4) {
    iVar16 = 0;
    do {
      pVVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.repeatedcordfield_.super_RepeatedPtrFieldBase,
                          iVar16);
      field_name_04._M_str = in_R9;
      field_name_04._M_len = (size_t)"edition_unittest.TestCamelCaseFieldNames.RepeatedCordField";
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)(pVVar7->_M_dataplus)._M_p,
                 (char *)(ulong)(uint)pVVar7->_M_string_length,1,0x3a,field_name_04);
      sVar2 = pVVar7->_M_string_length;
      if (((long)sVar2 < 0x80) && ((long)sVar2 <= (long)(stream->end_ + (0xe - (long)pWVar6)))) {
        *pWVar6 = (WireFormatLite)0x62;
        pWVar6[1] = SUB81(sVar2,0);
        memcpy(pWVar6 + 2,(pVVar7->_M_dataplus)._M_p,sVar2);
        pWVar6 = pWVar6 + sVar2 + 2;
      }
      else {
        s_04._M_str = (pVVar7->_M_dataplus)._M_p;
        s_04._M_len = sVar2;
        pWVar6 = (WireFormatLite *)
                 google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,0xc,s_04,(uint8_t *)pWVar6);
      }
      iVar16 = iVar16 + 1;
    } while (iVar4 != iVar16);
  }
  uVar13 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar13 & 1) != 0) {
    puVar9 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar13 & 0xfffffffffffffffe) + 8),(uint8_t *)pWVar6,
                        stream);
    return puVar9;
  }
  return (uint8_t *)pWVar6;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestCamelCaseFieldNames::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestCamelCaseFieldNames& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestCamelCaseFieldNames)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 PrimitiveField = 1;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_primitivefield(), target);
  }

  // string StringField = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::absl::string_view _s = this_._internal_stringfield();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.StringField");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // .edition_unittest.ForeignEnum EnumField = 3;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        3, this_._internal_enumfield(), target);
  }

  // .edition_unittest.ForeignMessage MessageField = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.messagefield_, this_._impl_.messagefield_->GetCachedSize(), target,
        stream);
  }

  // string StringPieceField = 5 [ctype = STRING_PIECE];
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::absl::string_view _s = this_._internal_stringpiecefield();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.StringPieceField");
    target = stream->WriteStringMaybeAliased(5, _s, target);
  }

  // string CordField = 6 [ctype = CORD];
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_cordfield();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.CordField");
    target = stream->WriteStringMaybeAliased(6, _s, target);
  }

  // repeated int32 RepeatedPrimitiveField = 7;
  {
    int byte_size = this_._impl_._repeatedprimitivefield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          7, this_._internal_repeatedprimitivefield(), byte_size, target);
    }
  }

  // repeated string RepeatedStringField = 8;
  for (int i = 0, n = this_._internal_repeatedstringfield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedstringfield().Get(i);
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.RepeatedStringField");
    target = stream->WriteString(8, s, target);
  }

  // repeated .edition_unittest.ForeignEnum RepeatedEnumField = 9;
  {
    ::size_t byte_size = this_._impl_._repeatedenumfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          9, this_._internal_repeatedenumfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.ForeignMessage RepeatedMessageField = 10;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeatedmessagefield_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeatedmessagefield().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            10, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated string RepeatedStringPieceField = 11 [ctype = STRING_PIECE];
  for (int i = 0, n = this_._internal_repeatedstringpiecefield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedstringpiecefield().Get(i);
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.RepeatedStringPieceField");
    target = stream->WriteString(11, s, target);
  }

  // repeated string RepeatedCordField = 12 [ctype = CORD];
  for (int i = 0, n = this_._internal_repeatedcordfield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedcordfield().Get(i);
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.RepeatedCordField");
    target = stream->WriteString(12, s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestCamelCaseFieldNames)
  return target;
}